

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

bool __thiscall
SI_GenericNoCase<char>::operator()(SI_GenericNoCase<char> *this,char *pLeft,char *pRight)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  long cmp;
  char *pRight_local;
  char *pLeft_local;
  SI_GenericNoCase<char> *this_local;
  
  cmp = (long)pRight;
  pRight_local = pLeft;
  while( true ) {
    bVar3 = false;
    if (*pRight_local != '\0') {
      bVar3 = *(char *)cmp != '\0';
    }
    if (!bVar3) break;
    cVar1 = locase(this,*pRight_local);
    cVar2 = locase(this,*(char *)cmp);
    if ((long)cVar1 != (long)cVar2) {
      return (long)cVar1 - (long)cVar2 < 0;
    }
    pRight_local = pRight_local + 1;
    cmp = cmp + 1;
  }
  return *(char *)cmp != '\0';
}

Assistant:

bool operator()(const SI_CHAR *pLeft, const SI_CHAR *pRight) const {
		long cmp;
		for (; *pLeft && *pRight; ++pLeft, ++pRight) {
			cmp = (long)locase(*pLeft) - (long)locase(*pRight);
			if (cmp != 0) {
				return cmp < 0;
			}
		}
		return *pRight != 0;
	}